

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgkns(fitsfile *fptr,char *keyname,int nstart,int nmax,char **value,int *nfound,int *status)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int nrec;
  int iVar9;
  char *__src;
  long ival;
  int tstatus;
  int nkeys;
  int *local_1a0;
  long local_198;
  char **local_190;
  int mkeys;
  char keyindex [8];
  char keyroot [75];
  char svalue [71];
  char comm [73];
  char card [81];
  
  iVar9 = *status;
  if (iVar9 < 1) {
    *nfound = 0;
    keyroot[0] = '\0';
    local_190 = value;
    strncat(keyroot,keyname,0x4a);
    sVar3 = strlen(keyroot);
    iVar9 = (int)sVar3;
    if (iVar9 == 0) {
LAB_001a8ff4:
      iVar9 = *status;
    }
    else {
      uVar8 = 0;
      uVar7 = 0;
      local_1a0 = nfound;
      if (0 < iVar9) {
        uVar7 = sVar3 & 0xffffffff;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        pp_Var4 = __ctype_toupper_loc();
        keyroot[uVar8] = (char)(*pp_Var4)[keyroot[uVar8]];
      }
      ffghps(fptr,&nkeys,&mkeys,status);
      __src = card + iVar9;
      local_198 = (long)(nstart + nmax + -1);
      lVar6 = (long)nstart;
      bVar1 = false;
      for (nrec = 3; nrec <= nkeys; nrec = nrec + 1) {
        iVar2 = ffgrec(fptr,nrec,card,status);
        if (0 < iVar2) goto LAB_001a8ff4;
        iVar2 = strncmp(keyroot,card,(long)iVar9);
        if (iVar2 == 0) {
          keyindex[0] = '\0';
          pcVar5 = strchr(card,0x3d);
          if (pcVar5 != (char *)0x0) {
            sVar3 = (long)pcVar5 - (long)__src;
            if (7 < (long)sVar3) {
              *status = 0xcf;
              return 0xcf;
            }
            strncat(keyindex,__src,sVar3);
            tstatus = 0;
            iVar2 = ffc2ii(keyindex,&ival,&tstatus);
            if ((iVar2 < 1) && (lVar6 <= ival && ival <= local_198)) {
              ffpsvc(card,svalue,comm,status);
              ffc2s(svalue,local_190[ival - lVar6],status);
              if ((long)*local_1a0 <= ival - lVar6) {
                *local_1a0 = (int)(ival - lVar6) + 1;
              }
              if (*status == 0xcc) {
                *status = 0;
                bVar1 = true;
              }
            }
          }
        }
      }
      iVar9 = *status;
      if (iVar9 < 1 && bVar1) {
        *status = 0xcc;
        iVar9 = 0xcc;
      }
    }
  }
  return iVar9;
}

Assistant:

int ffgkns( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyname,      /* I - root name of keywords to read        */
            int  nstart,        /* I - starting index number                */
            int  nmax,          /* I - maximum number of keywords to return */
            char *value[],      /* O - array of pointers to keyword values  */
            int  *nfound,       /* O - number of values that were returned  */
            int  *status)       /* IO - error status                        */
/*
  Read (get) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NMAX -1) inclusive.  
  This routine does NOT support the HEASARC long string convention.
*/
{
    int nend, lenroot, ii, nkeys, mkeys, tstatus, undefinedval;
    long ival;
    char keyroot[FLEN_KEYWORD], keyindex[8], card[FLEN_CARD];
    char svalue[FLEN_VALUE], comm[FLEN_COMMENT], *equalssign;

    if (*status > 0)
        return(*status);

    *nfound = 0;
    nend = nstart + nmax - 1;

    keyroot[0] = '\0';
    strncat(keyroot, keyname, FLEN_KEYWORD - 1);
     
    lenroot = strlen(keyroot);
    
    if (lenroot == 0)     /*  root must be at least 1 char long  */
        return(*status);

    for (ii=0; ii < lenroot; ii++)           /*  make sure upper case  */
        keyroot[ii] = toupper(keyroot[ii]);

    ffghps(fptr, &nkeys, &mkeys, status);  /*  get the number of keywords  */

    undefinedval = FALSE;
    for (ii=3; ii <= nkeys; ii++)  
    {
       if (ffgrec(fptr, ii, card, status) > 0)     /*  get next keyword  */
           return(*status);

       if (strncmp(keyroot, card, lenroot) == 0)  /* see if keyword matches */
       {
          keyindex[0] = '\0';
          equalssign = strchr(card, '=');
	  if (equalssign == 0) continue;  /* keyword has no value */

          if (equalssign - card - lenroot > 7)
          {
             return (*status=BAD_KEYCHAR);
          }
          strncat(keyindex, &card[lenroot], equalssign - card  - lenroot);  /*  copy suffix  */
          tstatus = 0;
          if (ffc2ii(keyindex, &ival, &tstatus) <= 0)     /*  test suffix  */
          {
             if (ival <= nend && ival >= nstart)
             {
                ffpsvc(card, svalue, comm, status);  /*  parse the value */
                ffc2s(svalue, value[ival-nstart], status); /* convert */
                if (ival - nstart + 1 > *nfound)
                      *nfound = ival - nstart + 1;  /*  max found */ 

                if (*status == VALUE_UNDEFINED)
                {
                   undefinedval = TRUE;
                   *status = 0;  /* reset status to read remaining values */
                }
             }
          }
       }
    }
    if (undefinedval && (*status <= 0) )
        *status = VALUE_UNDEFINED;  /* report at least 1 value undefined */

    return(*status);
}